

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_b64encode.c
# Opt level: O2

void b64_encode(archive_string *as,uchar *p,size_t len)

{
  char c;
  uint uVar1;
  byte *pbVar2;
  
  pbVar2 = p + 2;
  for (; 2 < len; len = len - 3) {
    archive_strappend_char
              (as,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [pbVar2[-2] >> 2]);
    archive_strappend_char
              (as,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(uint)(pbVar2[-1] >> 4) | (pbVar2[-2] & 3) << 4]);
    archive_strappend_char
              (as,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(uint)(*pbVar2 >> 6) + (pbVar2[-1] & 0xf) * 4]);
    archive_strappend_char
              (as,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[*pbVar2 & 0x3f]
              );
    pbVar2 = pbVar2 + 3;
  }
  if (len != 0) {
    archive_strappend_char
              (as,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [pbVar2[-2] >> 2]);
    uVar1 = (pbVar2[-2] & 3) << 4;
    if (len == 1) {
      archive_strappend_char
                (as,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar1]);
      c = '=';
    }
    else {
      archive_strappend_char
                (as,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                    [(byte)((byte)uVar1 | pbVar2[-1] >> 4)]);
      c = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
          [(ulong)(pbVar2[-1] & 0xf) * 4];
    }
    archive_strappend_char(as,c);
    archive_strappend_char(as,'=');
  }
  archive_strappend_char(as,'\n');
  return;
}

Assistant:

static void
b64_encode(struct archive_string *as, const unsigned char *p, size_t len)
{
	int c;

	for (; len >= 3; p += 3, len -= 3) {
		c = p[0] >> 2;
		archive_strappend_char(as, base64[c]);
		c = ((p[0] & 0x03) << 4) | ((p[1] & 0xf0) >> 4);
		archive_strappend_char(as, base64[c]);
		c = ((p[1] & 0x0f) << 2) | ((p[2] & 0xc0) >> 6);
		archive_strappend_char(as, base64[c]);
		c = p[2] & 0x3f;
		archive_strappend_char(as, base64[c]);
	}
	if (len > 0) {
		c = p[0] >> 2;
		archive_strappend_char(as, base64[c]);
		c = (p[0] & 0x03) << 4;
		if (len == 1) {
			archive_strappend_char(as, base64[c]);
			archive_strappend_char(as, '=');
			archive_strappend_char(as, '=');
		} else {
			c |= (p[1] & 0xf0) >> 4;
			archive_strappend_char(as, base64[c]);
			c = (p[1] & 0x0f) << 2;
			archive_strappend_char(as, base64[c]);
			archive_strappend_char(as, '=');
		}
	}
	archive_strappend_char(as, '\n');
}